

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_TestShell::createTest
          (TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test *this_00;
  TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_TestShell *this_local;
  
  this_00 = (TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x232);
  TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test::
  TEST_JUnitOutputTest_testFailureWithAmpersandsAndLessThan_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithAmpersandsAndLessThan)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("&object1 < &object2", "importantFile", 999)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"importantFile:999: &amp;object1 &lt; &amp;object2\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}